

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::TopKLayerParams::TopKLayerParams(TopKLayerParams *this,TopKLayerParams *from)

{
  void *pvVar1;
  uint64 uVar2;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__TopKLayerParams_00728a98;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->usebottomk_ = from->usebottomk_;
  uVar2 = from->k_;
  this->axis_ = from->axis_;
  this->k_ = uVar2;
  return;
}

Assistant:

TopKLayerParams::TopKLayerParams(const TopKLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&axis_, &from.axis_,
    reinterpret_cast<char*>(&usebottomk_) -
    reinterpret_cast<char*>(&axis_) + sizeof(usebottomk_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.TopKLayerParams)
}